

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O3

void __thiscall
Js::InterpreterStackFrame::OP_ScopedInitFunc<Js::LayoutSizePolicy<(Js::LayoutSize)2>>
          (InterpreterStackFrame *this,
          OpLayoutT_ElementScopedC<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *playout)

{
  FunctionBody *this_00;
  
  this_00 = *(FunctionBody **)(this + 0x88);
  if ((~*(ushort *)&(this_00->super_ParseableFunctionInfo).super_FunctionProxy.field_0x45 & 0x1100)
      == 0) {
    GetLocalFrameDisplay(this);
    this_00 = *(FunctionBody **)(this + 0x88);
  }
  FunctionBody::GetReferencedPropertyId(this_00,playout->PropertyIdIndex);
  ValidateRegValue(this,*(Var *)(this + (ulong)playout->Value * 8 + 0x160),false,true);
}

Assistant:

void InterpreterStackFrame::OP_ScopedInitFunc(const unaligned OpLayoutT_ElementScopedC<T> * playout)
    {
        JavascriptOperators::OP_InitFuncScoped(GetEnvForEvalCode(),
            m_functionBody->GetReferencedPropertyId(playout->PropertyIdIndex),
            GetReg(playout->Value), GetReg(Js::FunctionBody::RootObjectRegSlot), GetScriptContext());
    }